

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PushColumnClipRect(int column_index)

{
  ImGuiColumns *pIVar1;
  ImGuiColumnData *pIVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  pIVar2 = (pIVar1->Columns).Data;
  PushClipRect(&pIVar2[column_index].ClipRect.Min,&pIVar2[column_index].ClipRect.Max,false);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }